

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::TemperatureGroup> *
metaf::TemperatureGroup::parse(string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  int iVar2;
  string *s;
  Temperature *pTVar3;
  difference_type dVar4;
  int in_EDX;
  optional<metaf::TemperatureGroup> *in_RDI;
  _Optional_payload_base<metaf::Temperature> _Var5;
  _Optional_payload_base<metaf::Temperature> _Var6;
  optional<metaf::Temperature> dp_1;
  TemperatureGroup result_1;
  optional<metaf::Temperature> t_1;
  optional<metaf::Temperature> dp;
  TemperatureGroup result;
  optional<metaf::Temperature> t;
  smatch match;
  undefined4 in_stack_fffffffffffffdf8;
  Type in_stack_fffffffffffffdfc;
  TemperatureGroup *in_stack_fffffffffffffe00;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe08;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe10;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe30;
  flag_type __f;
  char *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  string local_190 [32];
  _Optional_payload_base<metaf::Temperature> local_170;
  _Optional_payload_base<int> local_15c;
  undefined2 local_154;
  _Optional_payload_base<int> local_150;
  undefined2 local_148;
  string local_140 [32];
  _Optional_payload_base<metaf::Temperature> local_120;
  string local_d0 [36];
  _Optional_payload_base<metaf::Temperature> local_ac;
  _Optional_payload_base<int> local_98;
  undefined2 local_90;
  _Optional_payload_base<int> local_8c;
  undefined2 local_84;
  undefined4 local_7c;
  string local_78 [32];
  _Optional_payload_base<metaf::Temperature> local_58;
  int local_c;
  
  __f = (flag_type)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  local_c = in_EDX;
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       rgx_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::rgx_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38,__f);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::rgx_abi_cxx11_);
  }
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       rmkRgx_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::rmkRgx_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38,__f);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rmkRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::rmkRgx_abi_cxx11_);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffe00);
  if ((local_c == 2) &&
     (bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10,
                         (match_flag_type)((ulong)in_stack_fffffffffffffe08 >> 0x20)), bVar1)) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
    local_58 = (_Optional_payload_base<metaf::Temperature>)
               Temperature::fromString(in_stack_fffffffffffffe40);
    std::__cxx11::string::~string(local_78);
    bVar1 = std::optional<metaf::Temperature>::has_value((optional<metaf::Temperature> *)0x259581);
    if (bVar1) {
      TemperatureGroup(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                       SUB41((uint)in_stack_fffffffffffffdf8 >> 0x18,0));
      pTVar3 = std::optional<metaf::Temperature>::operator*
                         ((optional<metaf::Temperature> *)0x259658);
      local_90._0_1_ = pTVar3->freezing;
      local_90._1_1_ = pTVar3->precise;
      local_98 = (pTVar3->tempValue).super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>;
      s = (string *)
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffffe00,
                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if (s != (string *)0x0) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
        local_ac = (_Optional_payload_base<metaf::Temperature>)Temperature::fromString(s);
        std::__cxx11::string::~string(local_d0);
        bVar1 = std::optional<metaf::Temperature>::has_value
                          ((optional<metaf::Temperature> *)0x259700);
        if (!bVar1) {
          memcpy(in_RDI,&parse::notRecognised,0x24);
          goto LAB_00259aa3;
        }
        pTVar3 = std::optional<metaf::Temperature>::operator*
                           ((optional<metaf::Temperature> *)0x25975d);
        local_8c = (pTVar3->tempValue).super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>;
        local_84._0_1_ = pTVar3->freezing;
        local_84._1_1_ = pTVar3->precise;
      }
      std::optional<metaf::TemperatureGroup>::optional<metaf::TemperatureGroup,_true>
                ((optional<metaf::TemperatureGroup> *)in_stack_fffffffffffffe00,
                 (TemperatureGroup *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    else {
      memcpy(in_RDI,&parse::notRecognised,0x24);
    }
    goto LAB_00259aa3;
  }
  if (local_c == 4) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe00,
                            (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (bVar1) {
      TemperatureGroup(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                       SUB41((uint)in_stack_fffffffffffffdf8 >> 0x18,0));
      std::optional<metaf::TemperatureGroup>::optional<metaf::TemperatureGroup,_true>
                ((optional<metaf::TemperatureGroup> *)in_stack_fffffffffffffe00,
                 (TemperatureGroup *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      goto LAB_00259aa3;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe00,
                            (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (bVar1) {
      TemperatureGroup(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                       SUB41((uint)in_stack_fffffffffffffdf8 >> 0x18,0));
      std::optional<metaf::TemperatureGroup>::optional<metaf::TemperatureGroup,_true>
                ((optional<metaf::TemperatureGroup> *)in_stack_fffffffffffffe00,
                 (TemperatureGroup *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      goto LAB_00259aa3;
    }
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10
                       ,(match_flag_type)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    if (bVar1) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
      _Var5 = (_Optional_payload_base<metaf::Temperature>)
              Temperature::fromRemarkString(in_stack_fffffffffffffe20);
      local_120 = _Var5;
      std::__cxx11::string::~string(local_140);
      bVar1 = std::optional<metaf::Temperature>::has_value((optional<metaf::Temperature> *)0x2598e7)
      ;
      if (bVar1) {
        TemperatureGroup(in_stack_fffffffffffffe00);
        pTVar3 = std::optional<metaf::Temperature>::operator*
                           ((optional<metaf::Temperature> *)0x259951);
        local_154._0_1_ = pTVar3->freezing;
        local_154._1_1_ = pTVar3->precise;
        local_15c = (pTVar3->tempValue).super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>;
        dVar4 = std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffe00,
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        _Var6._8_8_ = in_stack_fffffffffffffe00;
        _Var6._M_payload._M_value.tempValue.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> = (optional<int>)(optional<int>)in_stack_fffffffffffffe08;
        if (dVar4 != 0) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
          _Var6 = (_Optional_payload_base<metaf::Temperature>)
                  Temperature::fromRemarkString(_Var5._M_payload._0_8_);
          local_170 = _Var6;
          std::__cxx11::string::~string(local_190);
          bVar1 = std::optional<metaf::Temperature>::has_value
                            ((optional<metaf::Temperature> *)0x2599f0);
          if (!bVar1) {
            memcpy(in_RDI,&parse::notRecognised,0x24);
            goto LAB_00259aa3;
          }
          pTVar3 = std::optional<metaf::Temperature>::operator*
                             ((optional<metaf::Temperature> *)0x259a4a);
          local_150 = (pTVar3->tempValue).super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>;
          local_148._0_1_ = pTVar3->freezing;
          local_148._1_1_ = pTVar3->precise;
        }
        std::optional<metaf::TemperatureGroup>::optional<metaf::TemperatureGroup,_true>
                  (_Var6._8_8_,
                   (TemperatureGroup *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                  );
      }
      else {
        memcpy(in_RDI,&parse::notRecognised,0x24);
      }
      goto LAB_00259aa3;
    }
  }
  memcpy(in_RDI,&parse::notRecognised,0x24);
LAB_00259aa3:
  local_7c = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x259ab0);
  return in_RDI;
}

Assistant:

std::optional<TemperatureGroup> TemperatureGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	static const std::optional<TemperatureGroup> notRecognised;
	static const std::regex rgx("(M?\\d\\d|//)/(M?\\d\\d|//)?");
	static const auto matchTemperature = 1, matchDewPoint = 2;
	static const std::regex rmkRgx("T([01]\\d\\d\\d)([01]\\d\\d\\d)?");
	static const auto rmkMatchTemperature = 1, rmkMatchDewPoint = 2;
	std::smatch match;
	if (reportPart == ReportPart::METAR) {
		if (regex_match(group, match, rgx)) {
			const auto t = Temperature::fromString(match.str(matchTemperature));
			if (!t.has_value()) return notRecognised;
			TemperatureGroup result(Type::TEMPERATURE_AND_DEW_POINT);
			result.t = *t;
			if (match.length(matchDewPoint)) {
				const auto dp = Temperature::fromString(match.str(matchDewPoint));
				if (!dp.has_value()) return notRecognised;
				result.dp = *dp;
			}
			return result;
		}
	}
	if (reportPart == ReportPart::RMK) {
		if (group == "T") return TemperatureGroup(Type::T_MISG, true);
		if (group == "TD") return TemperatureGroup(Type::TD_MISG, true);
		if (regex_match(group, match, rmkRgx)) {
			const auto t = Temperature::fromRemarkString(match.str(rmkMatchTemperature));
			if (!t.has_value()) return notRecognised;
			TemperatureGroup result;
			result.t = *t;
			if (match.length(matchDewPoint)) {
				const auto dp = Temperature::fromRemarkString(match.str(rmkMatchDewPoint));
				if (!dp.has_value()) return notRecognised;
				result.dp = *dp;
			}
			return result;
		}
	}
	return notRecognised;
}